

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O2

void __thiscall TcpConnection::connected(TcpConnection *this)

{
  _Manager_type p_Var1;
  Logger *pLVar2;
  __shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  p_Var1 = (this->tc_connected_cb).super__Function_base._M_manager;
  pLVar2 = Logger::get_instance();
  if (p_Var1 == (_Manager_type)0x0) {
    if (-1 < pr_level && pLVar2->l_inited == false) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","connected",0x79);
    }
    if (1 < (int)g_log_level) {
      pLVar2 = Logger::get_instance();
      Logger::write_log(pLVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"connected",0x79,LOG_LEVEL_INFO,"tcp connected callback is null\n");
      pLVar2 = Logger::get_instance();
      Logger::flush(pLVar2);
      return;
    }
  }
  else {
    if (-1 < pr_level && pLVar2->l_inited == false) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","connected",0x75);
    }
    if (1 < (int)g_log_level) {
      pLVar2 = Logger::get_instance();
      Logger::write_log(pLVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"connected",0x75,LOG_LEVEL_INFO,
                        "execute connected callback, conn fd is %d\n",this->tc_fd);
      pLVar2 = Logger::get_instance();
      Logger::flush(pLVar2);
    }
    std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TcpConnection,void>
              (local_28,(__weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::operator()
              (&this->tc_connected_cb,(shared_ptr<TcpConnection> *)local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  return;
}

Assistant:

void TcpConnection::connected() {
    if(tc_connected_cb) {
        LOG_INFO("execute connected callback, conn fd is %d\n", tc_fd);
        tc_connected_cb(shared_from_this());
    }
    else {
        LOG_INFO("tcp connected callback is null\n");
    }
}